

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_3,bool polish)

{
  type_conflict5 tVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  element_type *peVar5;
  long lVar6;
  int *piVar7;
  byte in_CL;
  DataArray<int> *this_00;
  undefined8 in_RSI;
  long *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  bool instable;
  int cnt;
  int nr;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  max;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffecd8;
  undefined7 in_stack_ffffffffffffece0;
  undefined1 in_stack_ffffffffffffece7;
  undefined1 uVar8;
  SPxId *in_stack_ffffffffffffece8;
  undefined4 in_stack_ffffffffffffecf0;
  undefined4 in_stack_ffffffffffffecf4;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffed08;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *maxabs_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *max_00;
  int *in_stack_ffffffffffffed40;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffed48;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffed80;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffed88;
  int local_1240;
  undefined1 local_123c [44];
  double in_stack_ffffffffffffedf0;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffedf8;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffee18;
  undefined1 local_11bc [128];
  int local_113c;
  undefined1 local_1138 [40];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffeef0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffeef8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffef08;
  int *in_stack_ffffffffffffef10;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffef18;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffef48;
  undefined1 local_1030 [128];
  DataKey local_fb0;
  undefined1 local_fa8 [128];
  undefined1 local_f28 [128];
  undefined1 local_ea8 [96];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff1c0;
  int in_stack_fffffffffffff1cc;
  SPxId *in_stack_fffffffffffff1d0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff1d8;
  undefined1 local_da8 [128];
  undefined1 local_d28 [128];
  DataKey local_ca8;
  undefined8 local_ca0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c94;
  undefined1 local_c14 [128];
  undefined1 local_b94 [128];
  int local_b14;
  undefined1 local_b10 [128];
  undefined1 local_a90 [43];
  undefined1 in_stack_fffffffffffff59b;
  int in_stack_fffffffffffff59c;
  SPxId *in_stack_fffffffffffff5a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff5b0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff5b8;
  undefined1 local_a08 [35];
  undefined1 in_stack_fffffffffffff61b;
  int in_stack_fffffffffffff61c;
  SPxId *in_stack_fffffffffffff620;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff628;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff630;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff638;
  undefined1 local_980 [128];
  undefined1 local_900 [128];
  undefined1 local_880 [128];
  undefined1 local_800 [128];
  undefined1 local_780 [128];
  undefined1 local_700 [128];
  DataKey local_680;
  undefined8 local_678 [17];
  undefined8 local_5f0 [3];
  Real local_5d8;
  undefined1 local_5d0 [131];
  byte local_54d;
  int local_54c;
  undefined1 local_538 [16];
  Real local_528;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  undefined8 local_4a0;
  undefined1 local_498 [128];
  undefined1 local_418 [128];
  undefined1 local_398 [128];
  DataKey local_318;
  byte local_30d;
  undefined8 local_308;
  DataKey local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined1 *local_2e0;
  undefined8 local_2d8;
  Real *local_2d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2c8;
  undefined8 local_2c0;
  Real *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined1 *local_180;
  undefined8 local_178;
  undefined1 *local_170;
  Real *local_168;
  Real *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined1 *local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  undefined1 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined1 *local_118;
  undefined8 *local_110;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_101;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  int *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  undefined1 *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_30d = in_CL & 1;
  local_308 = in_RSI;
  SPxId::SPxId((SPxId *)0x78a9e3);
  local_2a8 = local_398;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
  local_2a0 = local_418;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
  local_4a0 = 0;
  local_2e0 = local_498;
  local_2e8 = &local_4a0;
  local_2f0 = 0;
  max_00 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)0x0;
  local_158 = local_2e8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
             (double)in_stack_ffffffffffffece8,
             (type *)CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
  maxabs_00 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_538;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(&in_stack_ffffffffffffecd8->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x78aaa8);
  local_528 = Tolerances::scaleAccordingToEpsilon(peVar5,1e-05);
  local_2c8 = &local_520;
  local_2d0 = &local_528;
  local_2d8 = 0;
  local_160 = local_2d0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
             (double)in_stack_ffffffffffffece8,
             (type *)CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78ab2c);
  local_54c = 0;
  resetTols(in_stack_ffffffffffffed08);
  lVar6 = (**(code **)(*in_RDI + 0x18))();
  local_54d = *(byte *)(lVar6 + 0xa60) & 1;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(&in_stack_ffffffffffffecd8->
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
  peVar5 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x78ab7f);
  local_5d8 = Tolerances::scaleAccordingToEpsilon(peVar5,1e-10);
  local_2b0 = local_5d0;
  local_2b8 = &local_5d8;
  local_2c0 = 0;
  local_168 = local_2b8;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<200U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
             (double)in_stack_ffffffffffffece8,
             (type *)CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78ac02);
  local_5f0[0] = 0;
  local_118 = local_418;
  local_120 = local_5f0;
  local_110 = local_120;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
  epsilonZero(in_stack_ffffffffffffecd8);
  tVar1 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffecd8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x78ac88);
  if (tVar1) {
    do {
      local_678[0] = 0;
      local_130 = local_498;
      local_138 = local_678;
      local_128 = local_138;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                (in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
      local_170 = local_398;
      local_178 = local_308;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
      local_680 = (DataKey)maxDelta(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,max_00,
                                    maxabs_00);
      local_318 = local_680;
      bVar2 = SPxId::isValid((SPxId *)&local_318);
      if (!bVar2) {
        return (SPxId)local_318;
      }
      local_270 = local_700;
      local_278 = local_398;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
      local_260 = local_780;
      local_268 = local_498;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
      bVar2 = shortEnter(in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
                         in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c0,
                         in_stack_fffffffffffff1b8);
      if (!bVar2) {
        local_298 = local_800;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
        local_290 = local_880;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
        local_250 = local_980;
        local_258 = local_498;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
        minStability(in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
        local_1a0 = local_880;
        local_1a8 = local_900;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
        if ((local_54d & 1) == 0) {
          local_230 = local_a90;
          local_238 = local_398;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
          local_318 = (DataKey)maxSelect(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                                         in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
                                         in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
        }
        else {
          local_240 = local_a08;
          local_248 = local_398;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
          local_318 = (DataKey)maxSelect(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                                         in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
                                         in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
        }
        local_b14 = 2;
        local_70 = local_b10;
        local_78 = &local_520;
        local_80 = &local_b14;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_81,local_78);
        local_68 = local_b10;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
        local_50 = local_b10;
        local_58 = local_78;
        local_60 = local_80;
        local_90 = (long)*local_80;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8,(longlong *)0x78b105)
        ;
        tVar1 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffecd8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x78b11a);
        if (tVar1) {
          local_54c = local_54c + 1;
        }
        else {
          local_54c = local_54c + 2;
        }
      }
      local_220 = local_b94;
      local_228 = local_498;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)
                 CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                 (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
      bVar2 = maxReEnter(in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                         in_stack_fffffffffffff628,in_stack_fffffffffffff620,
                         in_stack_fffffffffffff61c,(bool)in_stack_fffffffffffff61b);
    } while ((bVar2) && (relax(in_stack_ffffffffffffee18), local_54c < 2));
  }
  else {
    epsilonZero(in_stack_ffffffffffffecd8);
    local_f8 = local_c14;
    local_100 = &local_c94;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_101,local_100);
    local_e8 = local_c14;
    local_f0 = local_100;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
    local_e0 = local_c14;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate
              ((cpp_dec_float<200U,_int,_void> *)
               CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
    tVar1 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffecd8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x78b28d);
    if (tVar1) {
      do {
        local_ca0 = 0;
        local_148 = local_498;
        local_150 = &local_ca0;
        local_140 = local_150;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  (in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0);
        local_180 = local_398;
        local_188 = local_308;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
        local_ca8 = (DataKey)minDelta(in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,max_00,
                                      maxabs_00);
        local_318 = local_ca8;
        bVar2 = SPxId::isValid((SPxId *)&local_318);
        if (!bVar2) {
          return (SPxId)local_318;
        }
        local_210 = local_d28;
        local_218 = local_398;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
        local_200 = local_da8;
        local_208 = local_498;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
        bVar2 = shortEnter(in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
                           in_stack_fffffffffffff1cc,in_stack_fffffffffffff1c0,
                           in_stack_fffffffffffff1b8);
        if (!bVar2) {
          local_288 = &stack0xfffffffffffff1d8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
          local_280 = local_ea8;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
          local_1f0 = local_fa8;
          local_1f8 = local_498;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
          minStability(in_stack_ffffffffffffed88,in_stack_ffffffffffffed80);
          local_1b0 = local_ea8;
          local_1b8 = local_f28;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
          if ((local_54d & 1) == 0) {
            local_1d0 = &stack0xffffffffffffef48;
            local_1d8 = local_398;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
            local_318 = (DataKey)minSelect(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                                           in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
                                           in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
          }
          else {
            local_1e0 = local_1030;
            local_1e8 = local_398;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<200U,_int,_void> *)
                       CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                       (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
            local_fb0 = (DataKey)minSelect(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,
                                           in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
                                           in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
            local_318 = local_fb0;
          }
          local_113c = 2;
          local_b8 = local_1138;
          local_c0 = &local_520;
          local_c8 = &local_113c;
          boost::multiprecision::detail::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
          ::
          scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_c9,local_c0);
          local_b0 = local_1138;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0));
          local_98 = local_1138;
          local_a0 = local_c0;
          local_a8 = local_c8;
          local_d8 = (long)*local_c8;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
                    ((cpp_dec_float<200U,_int,_void> *)
                     CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                     (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8,
                     (longlong *)0x78b6be);
          tVar1 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffecd8,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x78b6d3);
          if (tVar1) {
            local_54c = local_54c + 1;
          }
          else {
            local_54c = local_54c + 2;
          }
        }
        local_1c0 = local_11bc;
        local_1c8 = local_498;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)
                   CONCAT17(in_stack_ffffffffffffece7,in_stack_ffffffffffffece0),
                   (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
        bVar2 = minReEnter(in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                           in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                           in_stack_fffffffffffff59c,(bool)in_stack_fffffffffffff59b);
      } while ((bVar2) && (relax(in_stack_ffffffffffffee18), local_54c < 2));
    }
  }
  if (((local_30d & 1) != 0) && (bVar2 = SPxId::isValid((SPxId *)&local_318), bVar2)) {
    if (*(int *)(in_RDI[1] + 0x5b4) == 1) {
      bVar2 = SPxId::isSPxRowId((SPxId *)&local_318);
      if (bVar2) {
        SPxId::SPxId((SPxId *)0x78b7e7);
        return (SPxId)local_2f8;
      }
      iVar3 = DataArray<int>::size((DataArray<int> *)(in_RDI[1] + 0x14b8));
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x78b815);
      if (iVar3 == iVar4) {
        lVar6 = in_RDI[1];
        iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_ffffffffffffecf4,in_stack_ffffffffffffecf0),
                         in_stack_ffffffffffffece8);
        piVar7 = DataArray<int>::operator[]((DataArray<int> *)(lVar6 + 0x14b8),iVar3);
        if (*piVar7 == 0) {
          SPxId::SPxId((SPxId *)0x78b863);
          return (SPxId)local_2f8;
        }
      }
    }
    else if (*(int *)(in_RDI[1] + 0x5b4) == 2) {
      iVar3 = DataArray<int>::size((DataArray<int> *)(in_RDI[1] + 0x14b8));
      iVar4 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x78b8ae);
      if (iVar3 == iVar4) {
        bVar2 = SPxId::isSPxColId((SPxId *)&local_318);
        if (bVar2) {
          this_00 = (DataArray<int> *)(in_RDI[1] + 0x14b8);
          iVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::number((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(iVar3,in_stack_ffffffffffffecf0),(SPxId *)this_00);
          piVar7 = DataArray<int>::operator[](this_00,iVar3);
          if (*piVar7 == 1) {
            SPxId::SPxId((SPxId *)0x78b90f);
            return (SPxId)local_2f8;
          }
        }
      }
      else {
        bVar2 = SPxId::isSPxColId((SPxId *)&local_318);
        if (bVar2) {
          SPxId::SPxId((SPxId *)0x78b936);
          return (SPxId)local_2f8;
        }
      }
    }
  }
  bVar2 = SPxId::isValid((SPxId *)&local_318);
  uVar8 = true;
  if (!bVar2) {
    in_stack_ffffffffffffecd8 =
         (SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)(in_RDI + 0x16);
    local_1240 = 2;
    epsilonZero(in_stack_ffffffffffffecd8);
    local_28 = local_123c;
    local_30 = &local_1240;
    local_38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&stack0xffffffffffffed40;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_123c;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)CONCAT17(uVar8,in_stack_ffffffffffffece0));
    local_8 = local_123c;
    local_10 = local_38;
    local_18 = local_30;
    local_48 = (long)*local_30;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
              ((cpp_dec_float<200U,_int,_void> *)CONCAT17(uVar8,in_stack_ffffffffffffece0),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8,(longlong *)0x78ba47);
    uVar8 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffecd8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x78ba58);
  }
  if ((type_conflict5)uVar8 != false) {
    local_190 = local_308;
    local_198 = local_418;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)CONCAT17(uVar8,in_stack_ffffffffffffece0),
               (cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffecd8);
    bVar2 = SPxId::isValid((SPxId *)&local_318);
    if (bVar2) {
      tighten(in_stack_ffffffffffffef48);
    }
  }
  return (SPxId)local_318;
}

Assistant:

SPxId SPxFastRT<R>::selectEnter(R& val, int, bool polish)
{
   SPxId enterId;
   R max, sel;
   R maxabs = 0.0;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int nr;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::LEAVE);

   resetTols();

   // force instable pivot iff true (see explanation in leave.hpp and spxsolve.hpp)
   bool instable = this->solver()->instableLeave;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableLeaveNum >= 0);

   sel = 0.0;

   if(val > epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;

         enterId = maxDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max >= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = maxSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = maxSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         maxabs = 0.0;
         max = val;
         enterId = minDelta(nr, max, maxabs);

         if(!enterId.isValid())
            return enterId;

         assert(max <= 0.0);
         assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

         if(!shortEnter(enterId, nr, max, maxabs))
         {
            R bestDelta, stab;

            stab = minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in leave.hpp and spxsolve.hpp)
            if(instable)
            {
               enterId = minSelect(nr, sel, lowstab, bestDelta, max);
            }
            else
            {
               enterId = minSelect(nr, sel, stab, bestDelta, max);
            }

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReEnter(sel, maxabs, enterId, nr, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }

   SPX_DEBUG(

      if(enterId.isValid())
{
   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

      R x;

      if(this->thesolver->isCoId(enterId))
         x = this->thesolver->coPvec().delta()[ this->thesolver->number(enterId) ];
      else
         x = this->thesolver->pVec().delta()[ this->thesolver->number(enterId) ];

      std::cout << "DFSTRT03 " << this->thesolver->basis().iteration() << ": "
                << sel << '\t' << x << " (" << maxabs << ")" << std::endl;
   }
   else
      std::cout << "DFSTRT04 " << this->thesolver->basis().iteration()
                << ": skipping instable pivot" << std::endl;
      )

      if(polish && enterId.isValid())
      {
         assert(this->thesolver->rep() == SPxSolverBase<R>::ROW);

         // decide whether the chosen entering index contributes to the polishing objective
         if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
         {
            // only allow (integer) variables to enter the basis
            if(enterId.isSPxRowId())
               return SPxId();
            else if(this->thesolver->integerVariables.size() == this->thesolver->nCols()
                    && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 0)
               return SPxId();
         }
         else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
         {
            // only allow slacks and continuous variables to enter the basis
            if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
            {
               if(enterId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(enterId)] == 1)
                  return SPxId();
            }
            else if(enterId.isSPxColId())
               return SPxId();
         }
      }


   if(enterId.isValid() || minStab > 2 * epsilonZero())
   {
      val = sel;

      if(enterId.isValid())
         tighten();
   }

   assert(!enterId.isValid() || !this->solver()->isBasic(enterId));

   return enterId;
}